

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O3

int32_t __thiscall
icu_63::SimpleDateFormat::matchDayPeriodStrings
          (SimpleDateFormat *this,UnicodeString *text,int32_t start,UnicodeString *data,
          int32_t dataCount,int32_t *dayPeriod)

{
  int32_t iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  if (0 < dataCount) {
    uVar2 = 0;
    uVar3 = 0xffffffff;
    iVar4 = 0;
    do {
      iVar1 = matchStringWithOptionalDot(text,start,data);
      if (iVar4 < iVar1) {
        uVar3 = uVar2 & 0xffffffff;
        iVar4 = iVar1;
      }
      uVar2 = uVar2 + 1;
      data = data + 1;
    } while ((uint)dataCount != uVar2);
    if (-1 < (int)uVar3) {
      *dayPeriod = (int)uVar3;
      return start + iVar4;
    }
  }
  return -start;
}

Assistant:

int32_t SimpleDateFormat::matchDayPeriodStrings(const UnicodeString& text, int32_t start,
                              const UnicodeString* data, int32_t dataCount,
                              int32_t &dayPeriod) const
{

    int32_t bestMatchLength = 0, bestMatch = -1;

    for (int32_t i = 0; i < dataCount; ++i) {
        int32_t matchLength = 0;
        if ((matchLength = matchStringWithOptionalDot(text, start, data[i])) > bestMatchLength) {
            bestMatchLength = matchLength;
            bestMatch = i;
        }
    }

    if (bestMatch >= 0) {
        dayPeriod = bestMatch;
        return start + bestMatchLength;
    }

    return -start;
}